

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O3

bool __thiscall
ArmParser::parseShift(ArmParser *this,Parser *parser,ArmOpcodeVariables *vars,bool immediateOnly)

{
  byte bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  byte bVar4;
  uchar uVar5;
  bool bVar6;
  int iVar7;
  Token *pTVar8;
  long lVar9;
  ArmParser *pAVar10;
  bool bVar11;
  bool bVar12;
  int64_t value;
  string stringValue;
  long *local_78;
  long local_70;
  long local_68 [2];
  Expression local_58;
  ArmParser *local_38;
  
  (vars->Shift).UseShift = false;
  pTVar8 = Tokenizer::peekToken
                     ((parser->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
  if (pTVar8->type != Comma) {
    return true;
  }
  Tokenizer::eatTokens
            ((parser->entries).
             super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].tokenizer,1);
  pTVar8 = Tokenizer::nextToken
                     ((parser->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
  if (pTVar8->type != Identifier) {
    return false;
  }
  local_38 = this;
  if (*(__index_type *)
       ((long)&(pTVar8->value).
               super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
       + 0x20) != '\x04') {
    __assert_fail("std::holds_alternative<Identifier>(value)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                  ,0x4d,"const Identifier &Token::identifierValue() const");
  }
  local_78 = local_68;
  lVar9 = *(long *)&(pTVar8->value).
                    super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                    super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                    .
                    super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                    .super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                    .super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                    .
                    super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                    ._M_u;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,lVar9,
             *(long *)((long)&(pTVar8->value).
                              super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      + 8) + lVar9);
  bVar4 = *(byte *)((long)local_78 + local_70 + -1);
  bVar1 = bVar4 - 0x30;
  if (bVar1 < 10) {
    lVar9 = 1;
    value = 0;
    do {
      value = value + ((ulong)bVar4 - 0x30) * lVar9;
      lVar9 = lVar9 * 10;
      std::__cxx11::string::pop_back();
      bVar4 = *(byte *)((long)local_78 + local_70 + -1);
    } while ((byte)(bVar4 - 0x30) < 10);
  }
  else {
    value = 0;
  }
  pAVar10 = (ArmParser *)&local_78;
  iVar7 = std::__cxx11::string::compare((char *)pAVar10);
  if (iVar7 == 0) {
    uVar5 = '\0';
LAB_001609af:
    (vars->Shift).Type = uVar5;
    if (bVar1 < 10) {
      createConstExpression(&local_58,value);
      _Var3._M_pi = local_58.expression.
                    super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
      peVar2 = local_58.expression.
               super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_58.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      local_58.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (vars->Shift).ShiftExpression.expression.
                super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      (vars->Shift).ShiftExpression.expression.
      super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
      (vars->Shift).ShiftExpression.expression.
      super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var3._M_pi;
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (vars->Shift).ShiftExpression.constExpression = local_58.constExpression;
      }
      else {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        (vars->Shift).ShiftExpression.constExpression = local_58.constExpression;
        if (local_58.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_58.expression.
                     super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
      }
      bVar11 = false;
    }
    else {
      bVar6 = parseRegisterTable(pAVar10,parser,&(vars->Shift).reg,armRegisters,0x13);
      pAVar10 = local_38;
      if (bVar6 && (vars->Shift).reg.num < 0x10) {
        bVar11 = true;
        if (immediateOnly) goto LAB_00160a37;
      }
      else {
        pTVar8 = Tokenizer::peekToken
                           ((parser->entries).
                            super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
        if (pTVar8->type == Hash) {
          Tokenizer::eatTokens
                    ((parser->entries).
                     super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                     _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,1);
        }
        bVar6 = parseImmediate(pAVar10,parser,&(vars->Shift).ShiftExpression);
        bVar12 = false;
        bVar11 = false;
        if (!bVar6) goto LAB_00160a90;
      }
    }
    (vars->Shift).ShiftByRegister = bVar11;
    (vars->Shift).UseShift = true;
    bVar12 = true;
  }
  else {
    pAVar10 = (ArmParser *)&local_78;
    iVar7 = std::__cxx11::string::compare((char *)pAVar10);
    if (iVar7 == 0) {
      uVar5 = '\0';
      goto LAB_001609af;
    }
    pAVar10 = (ArmParser *)&local_78;
    iVar7 = std::__cxx11::string::compare((char *)pAVar10);
    if (iVar7 == 0) {
      uVar5 = '\x01';
      goto LAB_001609af;
    }
    pAVar10 = (ArmParser *)&local_78;
    iVar7 = std::__cxx11::string::compare((char *)pAVar10);
    if (iVar7 == 0) {
      uVar5 = '\x02';
      goto LAB_001609af;
    }
    pAVar10 = (ArmParser *)&local_78;
    iVar7 = std::__cxx11::string::compare((char *)pAVar10);
    if (iVar7 == 0) {
      uVar5 = '\x03';
      goto LAB_001609af;
    }
    pAVar10 = (ArmParser *)&local_78;
    iVar7 = std::__cxx11::string::compare((char *)pAVar10);
    if (iVar7 == 0) {
      uVar5 = '\x04';
      goto LAB_001609af;
    }
LAB_00160a37:
    bVar12 = false;
  }
LAB_00160a90:
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  return bVar12;
}

Assistant:

bool ArmParser::parseShift(Parser& parser, ArmOpcodeVariables& vars, bool immediateOnly)
{
	// no shift is also valid
	vars.Shift.UseShift = false;
	if (parser.peekToken().type != TokenType::Comma)
		return true;

	parser.eatToken();

	// load shift mode
	const Token& shiftMode = parser.nextToken();
	if (shiftMode.type != TokenType::Identifier)
		return false;

	std::string stringValue = shiftMode.identifierValue().string();
	
	bool hasNumber = isNumber(stringValue.back());
	int64_t number = 0;

	// handle modeXX syntax
	if (hasNumber)
	{
		int64_t multiplier = 1;
		while (isNumber(stringValue.back()))
		{
			number += multiplier*(stringValue.back() - '0');
			multiplier *= 10;
			stringValue.pop_back();
		}
	}

	if (stringValue == "lsl" || stringValue == "asl")
		vars.Shift.Type = 0;
	else if (stringValue == "lsr")
		vars.Shift.Type = 1;
	else if (stringValue == "asr")
		vars.Shift.Type = 2;
	else if (stringValue == "ror")
		vars.Shift.Type = 3;
	else if (stringValue == "rrx")
		vars.Shift.Type = 4;
	else 
		return false;

	if (hasNumber)
	{
		vars.Shift.ShiftExpression = createConstExpression(number);
		vars.Shift.ShiftByRegister = false;
	} else if (parseRegister(parser,vars.Shift.reg))
	{
		if (immediateOnly)
			return false;

		vars.Shift.ShiftByRegister = true;
	} else {
		if (parser.peekToken().type == TokenType::Hash)
			parser.eatToken();
		
		if (!parseImmediate(parser,vars.Shift.ShiftExpression))
			return false;

		vars.Shift.ShiftByRegister = false;
	}
	
	vars.Shift.UseShift = true;
	return true;
}